

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall
CodeGenGenericContext::MemWrite(CodeGenGenericContext *this,x86Argument *address,x86Argument *value)

{
  undefined4 uVar1;
  x86Reg xVar2;
  int iVar3;
  uint uVar4;
  MemCache *pMVar5;
  ulong uVar6;
  uint local_28;
  uint newIndex;
  uint index;
  x86Argument *value_local;
  x86Argument *address_local;
  CodeGenGenericContext *this_local;
  
  MemInvalidate(this,address);
  uVar4 = MemFind(this,address);
  if (uVar4 == 0) {
    if (this->memCacheFreeSlotCount == 0) {
      local_28 = this->memCacheNextSlot;
      this->memCacheNextSlot = local_28 + 1;
      local_28 = local_28 & 0xf;
    }
    else {
      uVar4 = this->memCacheFreeSlotCount - 1;
      this->memCacheFreeSlotCount = uVar4;
      local_28 = this->memCacheFreeSlots[uVar4];
    }
    pMVar5 = this->memCache + local_28;
    uVar1 = *(undefined4 *)&address->field_0x4;
    (pMVar5->address).type = address->type;
    *(undefined4 *)&(pMVar5->address).field_0x4 = uVar1;
    (pMVar5->address).field_1 = address->field_1;
    xVar2 = address->ptrIndex;
    (pMVar5->address).ptrBase = address->ptrBase;
    (pMVar5->address).ptrIndex = xVar2;
    iVar3 = address->ptrNum;
    (pMVar5->address).ptrMult = address->ptrMult;
    (pMVar5->address).ptrNum = iVar3;
    uVar6 = (ulong)local_28;
    uVar1 = *(undefined4 *)&value->field_0x4;
    this->memCache[uVar6].value.type = value->type;
    *(undefined4 *)&this->memCache[uVar6].value.field_0x4 = uVar1;
    this->memCache[uVar6].value.field_1 = value->field_1;
    xVar2 = value->ptrIndex;
    this->memCache[uVar6].value.ptrBase = value->ptrBase;
    this->memCache[uVar6].value.ptrIndex = xVar2;
    iVar3 = value->ptrNum;
    this->memCache[uVar6].value.ptrMult = value->ptrMult;
    this->memCache[uVar6].value.ptrNum = iVar3;
    this->memCache[local_28].location = (uint)(((long)this->x86Op - (long)this->x86Base) / 0x50);
    this->memCache[local_28].read = false;
  }
  else {
    uVar4 = uVar4 - 1;
    uVar1 = *(undefined4 *)&value->field_0x4;
    this->memCache[uVar4].value.type = value->type;
    *(undefined4 *)&this->memCache[uVar4].value.field_0x4 = uVar1;
    this->memCache[uVar4].value.field_1 = value->field_1;
    xVar2 = value->ptrIndex;
    this->memCache[uVar4].value.ptrBase = value->ptrBase;
    this->memCache[uVar4].value.ptrIndex = xVar2;
    iVar3 = value->ptrNum;
    this->memCache[uVar4].value.ptrMult = value->ptrMult;
    this->memCache[uVar4].value.ptrNum = iVar3;
    this->memCache[uVar4].location = (uint)(((long)this->x86Op - (long)this->x86Base) / 0x50);
    this->memCache[uVar4].read = false;
  }
  return;
}

Assistant:

void CodeGenGenericContext::MemWrite(const x86Argument &address, const x86Argument &value)
{
	MemInvalidate(address);

	if(unsigned index = MemFind(address))
	{
		index--;

		memCache[index].value = value;
		memCache[index].location = unsigned(x86Op - x86Base);
		memCache[index].read = false;
	}
	else
	{
		unsigned newIndex = 0;

		if(memCacheFreeSlotCount)
			newIndex = memCacheFreeSlots[--memCacheFreeSlotCount];
		else
			newIndex = memCacheNextSlot++ % memoryStateSize;

		memCache[newIndex].address = address;
		memCache[newIndex].value = value;
		memCache[newIndex].location = unsigned(x86Op - x86Base);
		memCache[newIndex].read = false;
	}
}